

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchClass.c
# Opt level: O3

int Dch_ClassesRefine(Dch_Cla_t *p)

{
  int iVar1;
  Aig_Man_t *pAVar2;
  int iVar3;
  long lVar4;
  
  pAVar2 = p->pAig;
  if (pAVar2->vObjs->nSize < 1) {
    iVar3 = 0;
  }
  else {
    lVar4 = 0;
    iVar3 = 0;
    do {
      if (p->pId2Class[lVar4] != (Aig_Obj_t **)0x0) {
        iVar1 = Dch_ClassesRefineOneClass(p,*p->pId2Class[lVar4],0);
        iVar3 = iVar3 + iVar1;
        pAVar2 = p->pAig;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < pAVar2->vObjs->nSize);
  }
  return iVar3;
}

Assistant:

int Dch_ClassesRefine( Dch_Cla_t * p )
{
    Aig_Obj_t ** ppClass;
    int i, nRefis = 0;
    Dch_ManForEachClass( p, ppClass, i )
        nRefis += Dch_ClassesRefineOneClass( p, ppClass[0], 0 );
    return nRefis;
}